

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O0

Am_Object create_new_obj_internal(Am_Object *prototype,Am_Inter_Location *data)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  Am_Value *pAVar4;
  Am_Wrapper *pAVar5;
  Am_Object *pAVar6;
  ostream *poVar7;
  bool *in_RDX;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  undefined1 local_61;
  Am_Style local_60 [8];
  Am_Style color;
  Am_Object color_rect;
  undefined1 local_39;
  uint local_38;
  uint uStack_34;
  bool create_line;
  int d;
  int c;
  int b;
  int a;
  Am_Object ref_obj;
  Am_Inter_Location *data_local;
  Am_Object *prototype_local;
  Am_Object *new_obj;
  
  Am_Object::Am_Object((Am_Object *)&b);
  Am_Inter_Location::Get_Location
            (in_RDX,(Am_Object *)&local_39,&b,&c,&d,(int *)&stack0xffffffffffffffcc);
  bVar1 = Am_Object::operator!=((Am_Object *)&b,(Am_Object *)&created_objs);
  if (((bVar1 & 1) != 0) &&
     (Am_Translate_Coordinates((Am_Object *)&b,c,d,(Am_Object *)&created_objs,&c,&d),
     ((byte)local_39 & 1) != 0)) {
    Am_Translate_Coordinates
              ((Am_Object *)&b,uStack_34,local_38,(Am_Object *)&created_objs,
               (int *)&stack0xffffffffffffffcc,(int *)&local_38);
  }
  Am_Object::Am_Object((Am_Object *)&color);
  pAVar4 = (Am_Value *)Am_Object::Get(0xc6f0,0x169);
  Am_Object::operator=((Am_Object *)&color,pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)&color,0x6a);
  Am_Style::Am_Style(local_60,pAVar4);
  local_61 = 0;
  Am_Object::Am_Object(prototype);
  if (((byte)local_39 & 1) == 0) {
    bVar1 = Am_Object::Valid();
    if ((bVar1 & 1) == 0) {
      Am_Object::operator=(prototype,(Am_Object *)&Am_No_Object);
    }
    else {
      Am_Object::Create((char *)&local_78);
      uVar2 = Am_Object::Set((ushort)&local_78,100,(ulong)(uint)c);
      pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x65,(ulong)(uint)d);
      Am_Object::operator=(prototype,pAVar6);
      Am_Object::~Am_Object(&local_78);
      bVar1 = Am_Inter_Location::Get_Growing();
      uVar2 = (ushort)prototype;
      if ((bVar1 & 1) != 0) {
        uVar3 = Am_Object::Set(uVar2,0x66,(ulong)uStack_34);
        Am_Object::Set(uVar3,0x67,(ulong)local_38);
      }
      bVar1 = Am_Object::operator==((Am_Object *)data,(Am_Object *)&my_text_proto);
      if ((bVar1 & 1) == 0) {
        pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(local_60);
        Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar5);
      }
      else {
        pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(local_60);
        Am_Object::Set(uVar2,(Am_Wrapper *)0x6b,(ulong)pAVar5);
      }
    }
  }
  else {
    Am_Object::Create((char *)&local_70);
    pAVar5 = Am_Style::operator_cast_to_Am_Wrapper_(local_60);
    uVar2 = Am_Object::Set((ushort)&local_70,(Am_Wrapper *)0x6b,(ulong)pAVar5);
    uVar2 = Am_Object::Set(uVar2,0x8b,(ulong)(uint)c);
    uVar2 = Am_Object::Set(uVar2,0x8c,(ulong)(uint)d);
    uVar2 = Am_Object::Set(uVar2,0x8d,(ulong)uStack_34);
    pAVar6 = (Am_Object *)Am_Object::Set(uVar2,0x8e,(ulong)local_38);
    Am_Object::operator=(prototype,pAVar6);
    Am_Object::~Am_Object(&local_70);
    Set_XY_Anims_On(prototype);
  }
  bVar1 = Am_Object::Valid();
  if ((bVar1 & 1) != 0) {
    poVar7 = std::operator<<((ostream *)&std::cout,"\n--++-- Created new object ");
    poVar7 = (ostream *)operator<<(poVar7,(Am_Object *)prototype);
    poVar7 = std::operator<<(poVar7," at (");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,c);
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,d);
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,uStack_34);
    poVar7 = std::operator<<(poVar7,",");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_38);
    poVar7 = std::operator<<(poVar7,")\n");
    std::ostream::operator<<(poVar7,std::flush<char,std::char_traits<char>>);
    Am_Object::Am_Object(&local_80,(Am_Object *)prototype);
    Am_Object::Add_Part((Am_Object *)&created_objs,SUB81(&local_80,0),1);
    Am_Object::~Am_Object(&local_80);
    Am_Object::operator=(&last_created_obj,(Am_Object *)prototype);
  }
  local_61 = 1;
  Am_Style::~Am_Style(local_60);
  Am_Object::~Am_Object((Am_Object *)&color);
  Am_Object::~Am_Object((Am_Object *)&b);
  return (Am_Object)(Am_Object_Data *)prototype;
}

Assistant:

Am_Object
create_new_obj_internal(Am_Object prototype, Am_Inter_Location data)
{
  Am_Object ref_obj;
  int a, b, c, d;
  bool create_line;
  data.Get_Location(create_line, ref_obj, a, b, c, d);
  if (ref_obj != created_objs) {
    Am_Translate_Coordinates(ref_obj, a, b, created_objs, a, b);
    if (create_line)
      Am_Translate_Coordinates(ref_obj, c, d, created_objs, c, d);
  }

  Am_Object color_rect;
  color_rect = color_panel.Get(Am_VALUE);
  Am_Style color = color_rect.Get(Am_FILL_STYLE);

  Am_Object new_obj;
  if (create_line) {
    new_obj = prototype.Create()
                  .Set(Am_LINE_STYLE, color, Am_NO_ANIMATION)
                  .Set(Am_X1, a, Am_NO_ANIMATION)
                  .Set(Am_Y1, b, Am_NO_ANIMATION)
                  .Set(Am_X2, c, Am_NO_ANIMATION)
                  .Set(Am_Y2, d, Am_NO_ANIMATION);
    Set_XY_Anims_On(new_obj);
  } else if (prototype.Valid()) {
    new_obj = prototype.Create()
                  .Set(Am_LEFT, a, Am_NO_ANIMATION)
                  .Set(Am_TOP, b, Am_NO_ANIMATION);
    if (data.Get_Growing())
      new_obj.Set(Am_WIDTH, c, Am_NO_ANIMATION)
          .Set(Am_HEIGHT, d, Am_NO_ANIMATION);
    if (prototype == my_text_proto)
      new_obj.Set(Am_LINE_STYLE, color, Am_NO_ANIMATION);
    else
      new_obj.Set(Am_FILL_STYLE, color, Am_NO_ANIMATION);
  } else
    new_obj = Am_No_Object;

  if (new_obj.Valid()) {
    std::cout << "\n--++-- Created new object " << new_obj << " at (" << a
              << "," << b << "," << c << "," << d << ")\n"
              << std::flush;
    created_objs.Add_Part(new_obj);
    last_created_obj = new_obj;
  }
  return new_obj;
}